

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

void YM2612_Write(ym2612_ *YM2612,UINT8 adr,UINT8 data)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  channel_ *CH;
  
  switch(adr & 3) {
  case 0:
    YM2612->OPNAadr = (uint)data;
    break;
  case 1:
    lVar3 = (long)YM2612->OPNAadr;
    if (lVar3 == 0x2a) {
switchD_001291ab_caseD_2a:
      YM2612->DACdata = (uint)data * 0x40 + -0x2000;
      return;
    }
    uVar1 = YM2612->OPNAadr & 0xf0;
    if (0x2f < uVar1) {
      if (YM2612->REG[0][lVar3] == data) {
        return;
      }
      YM2612->REG[0][lVar3] = data;
      iVar4 = YM2612->OPNAadr;
      goto joined_r0x00129120;
    }
    YM2612->REG[0][lVar3] = data;
    switch(YM2612->OPNAadr) {
    case 0x22:
      if ((data & 8) == 0) {
        YM2612->LFOcnt = 0;
        YM2612->LFOinc = 0;
      }
      else {
        YM2612->LFOinc = YM2612->LFO_INC_TAB[data & 7];
      }
      break;
    case 0x24:
      iVar4 = (YM2612->TimerA & 3U) + (uint)data * 4;
      YM2612->TimerA = iVar4;
      iVar4 = iVar4 * -0x1000 + 0x400000;
      if (YM2612->TimerAL == iVar4) {
        return;
      }
      goto LAB_001292ab;
    case 0x25:
      uVar2 = (uint)(data & 3) | YM2612->TimerA & 0x3fcU;
      YM2612->TimerA = uVar2;
      iVar4 = uVar2 * -0x1000 + 0x400000;
      if (YM2612->TimerAL == iVar4) {
        return;
      }
LAB_001292ab:
      YM2612->TimerAL = iVar4;
      YM2612->TimerAcnt = iVar4;
      break;
    case 0x26:
      YM2612->TimerB = (uint)data;
      iVar4 = (uint)data * -0x10000 + 0x1000000;
      if (YM2612->TimerBL != iVar4) {
        YM2612->TimerBL = iVar4;
        YM2612->TimerBcnt = iVar4;
      }
      break;
    case 0x27:
      if (((YM2612->Mode ^ data) & 0x40) != 0) {
        YM2612_Special_Update(YM2612);
        YM2612->CHANNEL[2].SLOT[0].Finc = -1;
      }
      YM2612->Status = YM2612->Status & (uint)(data >> 2) & ~(uint)(data >> 4);
      YM2612->Mode = data;
      break;
    case 0x28:
      uVar2 = data & 3;
      if (uVar2 != 3) {
        uVar1 = uVar2 + 3;
        if ((data & 4) == 0) {
          uVar1 = uVar2;
        }
        CH = YM2612->CHANNEL + uVar1;
        YM2612_Special_Update(YM2612);
        if ((data & 0x10) == 0) {
          KEY_OFF(CH,0);
        }
        else {
          KEY_ON(CH,0);
        }
        if ((data & 0x20) == 0) {
          KEY_OFF(CH,2);
        }
        else {
          KEY_ON(CH,2);
        }
        if ((data & 0x40) == 0) {
          KEY_OFF(CH,1);
        }
        else {
          KEY_ON(CH,1);
        }
        if (-1 < (char)data) {
          KEY_OFF(CH,3);
          return;
        }
        KEY_ON(CH,3);
        return;
      }
      break;
    case 0x2a:
      goto switchD_001291ab_caseD_2a;
    case 0x2b:
      if (YM2612->DAC != (data & 0x80)) {
        YM2612_Special_Update(YM2612);
      }
      YM2612->DAC = data & 0x80;
    }
    break;
  case 2:
    YM2612->OPNBadr = (uint)data;
    break;
  case 3:
    uVar2 = YM2612->OPNBadr;
    uVar1 = uVar2 & 0xf0;
    if ((0x2f < uVar1) && (YM2612->REG[1][(int)uVar2] != data)) {
      YM2612->REG[1][(int)uVar2] = data;
      iVar4 = YM2612->OPNBadr + 0x100;
joined_r0x00129120:
      if (uVar1 < 0xa0) {
        SLOT_SET(YM2612,iVar4,data);
        return;
      }
      CHANNEL_SET(YM2612,iVar4,data);
      return;
    }
  }
  return;
}

Assistant:

void YM2612_Write(ym2612_ *YM2612, UINT8 adr, UINT8 data)
{
  /**
   * Possible addresses:
   * - 0: Part 1 register number.
   * - 1: Part 1 data.
   * - 2: Part 2 register number.
   * - 3: Part 2 data.
   */

  int d;
  switch (adr & 0x03)
  {
    case 0:
      YM2612->OPNAadr = data;
      break;

    case 1:
      // Trivial optimisation
      if (YM2612->OPNAadr == 0x2A)
      {
        YM2612->DACdata = ((int)data - 0x80) << DAC_SHIFT;
        return /*0*/;
      }

      d = YM2612->OPNAadr & 0xF0;

      if (d >= 0x30)
      {
        if (YM2612->REG[0][YM2612->OPNAadr] == data)
          return /*2*/;
        YM2612->REG[0][YM2612->OPNAadr] = data;

        if (d < 0xA0)    // SLOT
        {
          SLOT_SET(YM2612, YM2612->OPNAadr, data);
        }
        else        // CHANNEL
        {
          CHANNEL_SET(YM2612, YM2612->OPNAadr, data);
        }
      }
      else          // YM2612
      {
        YM2612->REG[0][YM2612->OPNAadr] = data;

        YM_SET(YM2612, YM2612->OPNAadr, data);
      }
      break;

    case 2:
      YM2612->OPNBadr = data;
      break;

    case 3:
      d = YM2612->OPNBadr & 0xF0;

      if (d >= 0x30)
      {
        if (YM2612->REG[1][YM2612->OPNBadr] == data)
          return /*2*/;
        YM2612->REG[1][YM2612->OPNBadr] = data;

        if (d < 0xA0)    // SLOT
        {
          SLOT_SET(YM2612, YM2612->OPNBadr + 0x100, data);
        }
        else        // CHANNEL
        {
          CHANNEL_SET(YM2612, YM2612->OPNBadr + 0x100, data);
        }
      }
      else
        return /*1*/;
      break;
  }

  return /*0*/;
}